

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topological_sort.h
# Opt level: O2

TopologicalOrdersImpl<std::monostate> * __thiscall
wasm::TopologicalOrdersImpl<std::monostate>::operator++(TopologicalOrdersImpl<std::monostate> *this)

{
  vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
  *this_00;
  undefined8 in_RAX;
  fd_set *__writefds;
  long lVar1;
  Index extraout_var;
  ulong uVar2;
  pointer pSVar4;
  fd_set *in_R8;
  timeval *in_R9;
  _Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector> _Var5;
  Selector local_50;
  _Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector> local_40;
  ulong uVar3;
  
  local_40._M_engaged = false;
  this_00 = &this->selectors;
  pSVar4 = (this->selectors).
           super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar2 = 0;
  uVar3 = local_40._8_8_;
  while (_Var5._8_8_ = uVar3, _Var5._M_payload._0_8_ = in_RAX,
        (this_00->
        super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
        )._M_impl.super__Vector_impl_data._M_start != pSVar4) {
    _Var5 = (_Optional_payload_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector>)
            Selector::advance(pSVar4 + -1,this);
    uVar3 = _Var5._8_8_;
    in_RAX = _Var5._M_payload._0_8_;
    uVar2 = uVar3 >> 0x20;
    if ((uVar3 >> 0x20 & 1) != 0) break;
    pSVar4 = (this->selectors).
             super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    (this->selectors).
    super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar4;
  }
  local_40 = _Var5;
  if ((uVar2 & 1) == 0) {
    if ((this->selectors).
        super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (this->selectors).
        super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __assert_fail("selectors.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                    ,0x8b,
                    "TopologicalOrdersImpl<F> &wasm::TopologicalOrdersImpl<>::operator++() [F = std::monostate]"
                   );
    }
  }
  else {
    if ((ulong)(((long)(this->graph->
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->graph->
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) / 0x18) <=
        (ulong)(((long)(this->selectors).
                       super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->selectors).
                      super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xc)) {
      __assert_fail("selectors.size() < graph.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                    ,0x90,
                    "TopologicalOrdersImpl<F> &wasm::TopologicalOrdersImpl<>::operator++() [F = std::monostate]"
                   );
    }
    std::
    vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
    ::push_back(this_00,(value_type *)&local_40);
    while( true ) {
      pSVar4 = (this->selectors).
               super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __writefds = (fd_set *)
                   (((long)pSVar4 -
                    (long)(this->selectors).
                          super__Vector_base<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0xc);
      lVar1 = (long)(this->graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->graph->
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
      if ((fd_set *)(lVar1 / 0x18) <= __writefds) break;
      local_50.start =
           Selector::select(pSVar4 + -1,(int)this,(fd_set *)(lVar1 % 0x18),__writefds,in_R8,in_R9);
      local_50.count = extraout_var;
      std::
      vector<wasm::TopologicalOrdersImpl<std::monostate>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<std::monostate>::Selector>_>
      ::emplace_back<wasm::TopologicalOrdersImpl<std::monostate>::Selector>(this_00,&local_50);
    }
  }
  return this;
}

Assistant:

TopologicalOrdersImpl& operator++() {
    // Find the last selector that can be advanced, popping any that cannot.
    std::optional<Selector> next;
    while (!selectors.empty() && !(next = selectors.back().advance(*this))) {
      selectors.pop_back();
    }
    if (!next) {
      // No selector could be advanced, so we've seen every possible ordering.
      assert(selectors.empty());
      return *this;
    }
    // We've advanced the last selector on the stack, so initialize the
    // subsequent selectors.
    assert(selectors.size() < graph.size());
    selectors.push_back(*next);
    while (selectors.size() < graph.size()) {
      selectors.push_back(selectors.back().select(*this));
    }

    return *this;
  }